

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 target,U32 mls,int extDict)

{
  BYTE *pBVar1;
  uint uVar2;
  BYTE *pBVar3;
  size_t sVar4;
  ulong uVar5;
  uint *puVar6;
  char cVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  BYTE *pBVar19;
  bool bVar20;
  uint local_b4;
  uint *local_b0;
  ulong local_a0;
  U32 dummy32;
  ulong local_78;
  BYTE *local_70;
  BYTE *local_68;
  byte *local_60;
  BYTE *local_58;
  BYTE *local_50;
  U32 *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar12 = (ms->cParams).hashLog;
  if (0x20 < uVar12) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  cVar7 = (char)uVar12;
  switch(mls) {
  case 5:
    lVar13 = -0x30e4432345000000;
    break;
  case 6:
    lVar13 = -0x30e4432340650000;
    break;
  case 7:
    lVar13 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar13 = -0x30e44323485a9b9d;
    break;
  default:
    uVar14 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar7 & 0x1fU));
    goto LAB_001ea907;
  }
  uVar14 = (ulong)(lVar13 * *(long *)ip) >> (-cVar7 & 0x3fU);
LAB_001ea907:
  uVar18 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  pBVar3 = (ms->window).base;
  uVar16 = (int)ip - (int)pBVar3;
  uVar12 = uVar16 - uVar18;
  if (uVar16 < uVar18) {
    uVar12 = 0;
  }
  uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar2 = (ms->window).lowLimit;
  uVar9 = target - uVar15;
  if (target - uVar2 <= uVar15) {
    uVar9 = uVar2;
  }
  if (ms->loadedDictEnd != 0) {
    uVar9 = uVar2;
  }
  iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (target < uVar16) {
    __assert_fail("curr <= target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x1dc,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x1dd,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  local_48 = ms->chainTable;
  uVar2 = ms->hashTable[uVar14];
  local_70 = (ms->window).dictBase;
  local_78 = (ulong)(ms->window).dictLimit;
  ms->hashTable[uVar14] = uVar16;
  if (uVar9 == 0) {
    __assert_fail("windowLow > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x1e0,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  local_50 = local_70 + local_78;
  local_58 = pBVar3 + local_78;
  uVar14 = (ulong)((uVar16 & uVar18) * 2);
  local_b0 = local_48 + uVar14;
  puVar8 = local_48 + uVar14 + 1;
  local_b4 = uVar16 + 9;
  local_a0 = 8;
  uVar14 = 0;
  uVar5 = 0;
  local_68 = ip;
  local_60 = iend;
  do {
    uVar10 = (ulong)uVar2;
    bVar20 = iVar17 == 0;
    iVar17 = iVar17 + -1;
    if ((bVar20) || (uVar2 < uVar9)) goto LAB_001eabaa;
    uVar11 = uVar14;
    if (uVar5 < uVar14) {
      uVar11 = uVar5;
    }
    local_40 = uVar14;
    local_38 = uVar5;
    if (uVar16 <= uVar2) {
      __assert_fail("matchIndex < curr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x1e4,
                    "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                   );
    }
    if ((extDict == 0) || (local_78 <= uVar10 + uVar11)) {
      if (uVar10 + uVar11 < local_78) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x1fc,
                      "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                     );
      }
      sVar4 = ZSTD_count(local_68 + uVar11,pBVar3 + uVar10 + uVar11,local_60);
      uVar5 = sVar4 + uVar11;
      pBVar19 = pBVar3 + uVar10;
    }
    else {
      pBVar1 = local_70 + uVar10;
      sVar4 = ZSTD_count_2segments(local_68 + uVar11,pBVar1 + uVar11,local_60,local_50,local_58);
      uVar5 = sVar4 + uVar11;
      pBVar19 = pBVar3 + uVar10;
      if (uVar5 + uVar10 < local_78) {
        pBVar19 = pBVar1;
      }
    }
    if ((local_a0 < uVar5) && (local_a0 = uVar5, local_b4 - uVar2 < uVar5)) {
      local_b4 = uVar2 + (int)uVar5;
    }
    if (local_68 + uVar5 == local_60) goto LAB_001eabaa;
    puVar6 = local_48 + (uVar2 & uVar18) * 2;
    if (pBVar19[uVar5] < local_68[uVar5]) {
      *local_b0 = uVar2;
      if (uVar2 <= uVar12) {
        local_b0 = &dummy32;
LAB_001eabaa:
        *puVar8 = 0;
        *local_b0 = 0;
        uVar12 = local_b4 - (uVar16 + 8);
        if (local_b4 < uVar16 + 8 || uVar12 == 0) {
          __assert_fail("matchEndIdx > curr + 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x223,
                        "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                       );
        }
        uVar18 = (int)local_a0 - 0x180;
        uVar16 = 0xc0;
        if (uVar18 < 0xc0) {
          uVar16 = uVar18;
        }
        uVar18 = 0;
        if (0x180 < local_a0) {
          uVar18 = uVar16;
        }
        if (uVar18 <= uVar12) {
          uVar18 = uVar12;
        }
        return uVar18;
      }
      puVar6 = puVar6 + 1;
      uVar14 = local_40;
      local_b0 = puVar6;
    }
    else {
      *puVar8 = uVar2;
      puVar8 = puVar6;
      uVar14 = uVar5;
      uVar5 = local_38;
      if (uVar2 <= uVar12) {
        puVar8 = &dummy32;
        goto LAB_001eabaa;
      }
    }
    uVar2 = *puVar6;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                const ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const target,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 curr = (U32)(ip-base);
    const U32 btLow = btMask >= curr ? 0 : curr - btMask;
    U32* smallerPtr = bt + 2*(curr&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    /* windowLow is based on target because
     * we only need positions that will be in the window at the end of the tree update.
     */
    U32 const windowLow = ZSTD_getLowestMatchIndex(ms, target, cParams->windowLog);
    U32 matchEndIdx = curr+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((curr-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((curr-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", curr);

    assert(curr <= target);
    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = curr;   /* Update Hash Table */

    assert(windowLow > 0);
    for (; nbCompares && (matchIndex >= windowLow); --nbCompares) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < curr);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > curr + 8);
        return MAX(positions, matchEndIdx - (curr + 8));
    }
}